

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::moveToThread_helper(QObjectPrivate *this)

{
  QObjectPrivate *this_00;
  qsizetype qVar1;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  QObject *child;
  int i;
  QObject *q;
  QEvent e;
  QEvent *in_stack_ffffffffffffff98;
  QEvent *in_stack_ffffffffffffffa0;
  int local_38;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)q_func(in_RDI);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)local_18,ThreadChange);
  QCoreApplication::sendEvent((QObject *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QBindingStorage::clear((QBindingStorage *)in_stack_ffffffffffffffa0);
  local_38 = 0;
  while( true ) {
    qVar1 = QList<QObject_*>::size(&(in_RDI->super_QObjectData).children);
    if (qVar1 <= local_38) break;
    QList<QObject_*>::at
              ((QList<QObject_*> *)in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    QObject::d_func((QObject *)0x3ee312);
    moveToThread_helper(this_00);
    local_38 = local_38 + 1;
  }
  QEvent::~QEvent(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::moveToThread_helper()
{
    Q_Q(QObject);
    QEvent e(QEvent::ThreadChange);
    QCoreApplication::sendEvent(q, &e);
    bindingStorage.clear();
    for (int i = 0; i < children.size(); ++i) {
        QObject *child = children.at(i);
        child->d_func()->moveToThread_helper();
    }
}